

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void test(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int32_t iVar5;
  size_type sVar6;
  const_reference pvVar7;
  ostream *poVar8;
  element_type *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int32_t labelId;
  shared_ptr<const_fasttext::Dictionary> dict;
  anon_class_1_0_00000001 writeMetric;
  ifstream ifs;
  Meter meter;
  FastText fasttext;
  real threshold;
  int32_t k;
  value_type *input;
  value_type *model;
  bool perLabel;
  FastText *in_stack_fffffffffffffbb8;
  Meter *in_stack_fffffffffffffbc0;
  allocator *in_stack_fffffffffffffbd0;
  int32_t k_00;
  ostream *in_stack_fffffffffffffbd8;
  Meter *in_stack_fffffffffffffbe0;
  FastText *in_stack_fffffffffffffbf0;
  allocator *paVar9;
  Meter *in_stack_fffffffffffffc38;
  real in_stack_fffffffffffffc40;
  int32_t in_stack_fffffffffffffc44;
  Dictionary *in_stack_fffffffffffffc48;
  FastText *in_stack_fffffffffffffc50;
  allocator local_3a1;
  string local_3a0 [39];
  undefined1 local_379 [40];
  allocator local_351;
  string local_350 [36];
  int local_32c;
  int local_314;
  undefined1 local_310 [344];
  string *in_stack_fffffffffffffe48;
  FastText *in_stack_fffffffffffffe50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](in_RDI,1);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if ((3 < sVar6) &&
     (sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI), sVar6 < 7)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,2);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](in_RDI,3);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (4 < sVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,4);
      std::__cxx11::stoi((string *)in_stack_fffffffffffffbc0,(size_t *)in_stack_fffffffffffffbb8,0);
    }
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (5 < sVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,5);
      std::__cxx11::stof((string *)in_stack_fffffffffffffbc0,(size_t *)in_stack_fffffffffffffbb8);
    }
    ::fasttext::FastText::FastText(in_stack_fffffffffffffbf0);
    ::fasttext::FastText::loadModel(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    ::fasttext::Meter::Meter(in_stack_fffffffffffffbc0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8);
    if (bVar3) {
      ::fasttext::FastText::test
                (in_stack_fffffffffffffc50,(istream *)in_stack_fffffffffffffc48,
                 in_stack_fffffffffffffc44,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    }
    else {
      std::ifstream::ifstream(local_310,(string *)pvVar7,_S_in);
      bVar4 = std::ifstream::is_open();
      if ((bVar4 & 1) == 0) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Test file cannot be opened!");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      ::fasttext::FastText::test
                (in_stack_fffffffffffffc50,(istream *)in_stack_fffffffffffffc48,
                 in_stack_fffffffffffffc44,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::ifstream::~ifstream(local_310);
    }
    k_00 = (int32_t)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
    if (bVar2) {
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
      local_314 = (int)std::setprecision(6);
      std::operator<<(poVar8,(_Setprecision)local_314);
      ::fasttext::FastText::getDictionary(in_stack_fffffffffffffbb8);
      local_32c = 0;
      while( true ) {
        iVar1 = local_32c;
        k_00 = (int32_t)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
        this = std::
               __shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a6595);
        iVar5 = ::fasttext::Dictionary::nlabels(this);
        if (iVar5 <= iVar1) break;
        paVar9 = &local_351;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_350,"F1-Score",paVar9);
        ::fasttext::Meter::f1Score
                  (in_stack_fffffffffffffbc0,(int32_t)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
        test::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbc0,
                   (string *)in_stack_fffffffffffffbb8,8.54768645966211e-318);
        std::__cxx11::string::~string(local_350);
        std::allocator<char>::~allocator((allocator<char> *)&local_351);
        in_stack_fffffffffffffbe0 = (Meter *)local_379;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_379 + 1),"Precision",(allocator *)in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffbd8 =
             (ostream *)
             ::fasttext::Meter::precision
                       (in_stack_fffffffffffffbc0,
                        (int32_t)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
        test::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbc0,
                   (string *)in_stack_fffffffffffffbb8,8.54831886368879e-318);
        std::__cxx11::string::~string((string *)(local_379 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_379);
        in_stack_fffffffffffffbd0 = &local_3a1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a0,"Recall",in_stack_fffffffffffffbd0);
        ::fasttext::Meter::recall
                  (in_stack_fffffffffffffbc0,(int32_t)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
        test::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)in_stack_fffffffffffffbc0,
                   (string *)in_stack_fffffffffffffbb8,8.54895126771547e-318);
        std::__cxx11::string::~string(local_3a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
        in_stack_fffffffffffffbc0 = (Meter *)std::operator<<((ostream *)&std::cout," ");
        std::
        __shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1a675a);
        ::fasttext::Dictionary::getLabel_abi_cxx11_
                  (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44);
        in_stack_fffffffffffffbb8 =
             (FastText *)
             std::operator<<((ostream *)in_stack_fffffffffffffbc0,(string *)&stack0xfffffffffffffc38
                            );
        std::ostream::operator<<(in_stack_fffffffffffffbb8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffc38);
        local_32c = local_32c + 1;
      }
      std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
                ((shared_ptr<const_fasttext::Dictionary> *)0x1a68de);
    }
    ::fasttext::Meter::writeGeneralMetrics(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,k_00)
    ;
    exit(0);
  }
  if (bVar2) {
    printTestLabelUsage();
  }
  else {
    printTestUsage();
  }
  exit(1);
}

Assistant:

void test(const std::vector<std::string>& args) {
  bool perLabel = args[1] == "test-label";

  if (args.size() < 4 || args.size() > 6) {
    perLabel ? printTestLabelUsage() : printTestUsage();
    exit(EXIT_FAILURE);
  }

  const auto& model = args[2];
  const auto& input = args[3];
  int32_t k = args.size() > 4 ? std::stoi(args[4]) : 1;
  real threshold = args.size() > 5 ? std::stof(args[5]) : 0.0;

  FastText fasttext;
  fasttext.loadModel(model);

  Meter meter;

  if (input == "-") {
    fasttext.test(std::cin, k, threshold, meter);
  } else {
    std::ifstream ifs(input);
    if (!ifs.is_open()) {
      std::cerr << "Test file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.test(ifs, k, threshold, meter);
  }

  if (perLabel) {
    std::cout << std::fixed << std::setprecision(6);
    auto writeMetric = [](const std::string& name, double value) {
      std::cout << name << " : ";
      if (std::isfinite(value)) {
        std::cout << value;
      } else {
        std::cout << "--------";
      }
      std::cout << "  ";
    };

    std::shared_ptr<const Dictionary> dict = fasttext.getDictionary();
    for (int32_t labelId = 0; labelId < dict->nlabels(); labelId++) {
      writeMetric("F1-Score", meter.f1Score(labelId));
      writeMetric("Precision", meter.precision(labelId));
      writeMetric("Recall", meter.recall(labelId));
      std::cout << " " << dict->getLabel(labelId) << std::endl;
    }
  }
  meter.writeGeneralMetrics(std::cout, k);

  exit(0);
}